

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

SavedPos __thiscall FScanner::SavePos(FScanner *this)

{
  char *pcVar1;
  SavedPos SVar2;
  
  if (this->ScriptOpen == false) {
    I_FatalError("SC_ call before SC_Open().");
  }
  if (this->End == false) {
    pcVar1 = this->ScriptPtr;
  }
  else {
    pcVar1 = (char *)0x0;
  }
  SVar2.SavedScriptLine = this->Line;
  SVar2.SavedScriptPtr = pcVar1;
  SVar2._12_4_ = 0;
  return SVar2;
}

Assistant:

const FScanner::SavedPos FScanner::SavePos ()
{
	SavedPos pos;

	CheckOpen ();
	if (End)
	{
		pos.SavedScriptPtr = NULL;
	}
	else
	{
		pos.SavedScriptPtr = ScriptPtr;
	}
	pos.SavedScriptLine = Line;
	return pos;
}